

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

TCGv_i64 clean_data_tbi(DisasContext_conflict1 *s,TCGv_i64 addr)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 clean;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 addr_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = new_tmp_a64_aarch64(s);
  tcg_gen_mov_i64_aarch64(tcg_ctx_00,ret,addr);
  return ret;
}

Assistant:

static TCGv_i64 clean_data_tbi(DisasContext *s, TCGv_i64 addr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 clean = new_tmp_a64(s);
    /*
     * In order to get the correct value in the FAR_ELx register,
     * we must present the memory subsystem with the "dirty" address
     * including the TBI.  In system mode we can make this work via
     * the TLB, dropping the TBI during translation.  But for user-only
     * mode we don't have that option, and must remove the top byte now.
     */
    tcg_gen_mov_i64(tcg_ctx, clean, addr);
    return clean;
}